

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  byte bVar9;
  BVH *bvh;
  NodeRef root;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  size_t k;
  undefined1 auVar13 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vbool<4> vVar23;
  char cVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  size_t mask;
  ulong uVar28;
  undefined4 uVar29;
  ulong uVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar31;
  ulong uVar32;
  NodeRef *pNVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  vfloat4 a0;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar71;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  float fVar74;
  float fVar82;
  float fVar83;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  undefined1 auVar81 [64];
  float fVar85;
  float fVar92;
  float fVar93;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  undefined1 auVar91 [64];
  float fVar95;
  float fVar97;
  float fVar98;
  undefined1 auVar96 [16];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar104 [64];
  
  auVar13 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar47 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar103 = vpcmpeqd_avx(auVar47,(undefined1  [16])valid_i->field_0);
    auVar47 = *(undefined1 (*) [16])(ray + 0x80);
    auVar40 = ZEXT816(0) << 0x40;
    auVar42 = vcmpps_avx(auVar47,auVar40,5);
    auVar42 = vandps_avx(auVar42,auVar103);
    uVar25 = vmovmskps_avx(auVar42);
    if (uVar25 != 0) {
      uVar28 = (ulong)(uVar25 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar54._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar54._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar54._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar54._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar103 = vrsqrtps_avx(auVar54);
      fVar56 = auVar103._0_4_;
      fVar59 = auVar103._4_4_;
      fVar60 = auVar103._8_4_;
      fVar61 = auVar103._12_4_;
      pre.depth_scale.field_0.v[0] = fVar56 * 1.5 + fVar56 * fVar56 * fVar56 * auVar54._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar59 * 1.5 + fVar59 * fVar59 * fVar59 * auVar54._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar60 * 1.5 + fVar60 * fVar60 * fVar60 * auVar54._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar61 * 1.5 + fVar61 * fVar61 * fVar61 * auVar54._12_4_ * -0.5
      ;
      auVar103._8_4_ = 0x80000000;
      auVar103._0_8_ = 0x8000000080000000;
      auVar103._12_4_ = 0x80000000;
      auVar104 = ZEXT1664(auVar103);
      do {
        lVar12 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar12 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar12 * 4 + 0x50)),0x1c);
        auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + lVar12 * 4 + 0x60)),0x28);
        fVar56 = *(float *)((long)pre.ray_space + lVar12 * 4 + -0x10);
        auVar63._0_4_ = auVar54._0_4_ * fVar56;
        auVar63._4_4_ = auVar54._4_4_ * fVar56;
        auVar63._8_4_ = auVar54._8_4_ * fVar56;
        auVar63._12_4_ = auVar54._12_4_ * fVar56;
        auVar52 = vshufpd_avx(auVar63,auVar63,1);
        auVar54 = vmovshdup_avx(auVar63);
        auVar75._0_4_ = auVar54._0_4_ ^ 0x80000000;
        auVar54 = vunpckhps_avx(auVar63,auVar40);
        auVar75._4_12_ = ZEXT812(0) << 0x20;
        auVar67 = vshufps_avx(auVar54,auVar75,0x41);
        auVar66._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
        auVar66._8_8_ = auVar52._8_8_ ^ auVar103._8_8_;
        auVar66 = vinsertps_avx(auVar66,auVar63,0x2a);
        auVar54 = vdpps_avx(auVar67,auVar67,0x7f);
        auVar52 = vdpps_avx(auVar66,auVar66,0x7f);
        auVar54 = vcmpps_avx(auVar52,auVar54,1);
        auVar54 = vshufps_avx(auVar54,auVar54,0);
        auVar54 = vblendvps_avx(auVar66,auVar67,auVar54);
        auVar52 = vdpps_avx(auVar54,auVar54,0x7f);
        auVar66 = vrsqrtss_avx(auVar52,auVar52);
        fVar59 = auVar66._0_4_;
        auVar52 = ZEXT416((uint)(fVar59 * 1.5 - auVar52._0_4_ * 0.5 * fVar59 * fVar59 * fVar59));
        auVar52 = vshufps_avx(auVar52,auVar52,0);
        auVar67._0_4_ = auVar54._0_4_ * auVar52._0_4_;
        auVar67._4_4_ = auVar54._4_4_ * auVar52._4_4_;
        auVar67._8_4_ = auVar54._8_4_ * auVar52._8_4_;
        auVar67._12_4_ = auVar54._12_4_ * auVar52._12_4_;
        auVar54 = vshufps_avx(auVar67,auVar67,0xc9);
        auVar52 = vshufps_avx(auVar63,auVar63,0xc9);
        auVar86._0_4_ = auVar52._0_4_ * auVar67._0_4_;
        auVar86._4_4_ = auVar52._4_4_ * auVar67._4_4_;
        auVar86._8_4_ = auVar52._8_4_ * auVar67._8_4_;
        auVar86._12_4_ = auVar52._12_4_ * auVar67._12_4_;
        auVar76._0_4_ = auVar63._0_4_ * auVar54._0_4_;
        auVar76._4_4_ = auVar63._4_4_ * auVar54._4_4_;
        auVar76._8_4_ = auVar63._8_4_ * auVar54._8_4_;
        auVar76._12_4_ = auVar63._12_4_ * auVar54._12_4_;
        auVar54 = vsubps_avx(auVar76,auVar86);
        auVar66 = vshufps_avx(auVar54,auVar54,0xc9);
        auVar54 = vdpps_avx(auVar66,auVar66,0x7f);
        auVar52 = vrsqrtss_avx(auVar54,auVar54);
        fVar59 = auVar52._0_4_;
        auVar54 = ZEXT416((uint)(fVar59 * 1.5 - auVar54._0_4_ * 0.5 * fVar59 * fVar59 * fVar59));
        auVar54 = vshufps_avx(auVar54,auVar54,0);
        auVar77._0_4_ = auVar54._0_4_ * auVar66._0_4_;
        auVar77._4_4_ = auVar54._4_4_ * auVar66._4_4_;
        auVar77._8_4_ = auVar54._8_4_ * auVar66._8_4_;
        auVar77._12_4_ = auVar54._12_4_ * auVar66._12_4_;
        auVar52._0_4_ = auVar63._0_4_ * fVar56;
        auVar52._4_4_ = auVar63._4_4_ * fVar56;
        auVar52._8_4_ = auVar63._8_4_ * fVar56;
        auVar52._12_4_ = auVar63._12_4_ * fVar56;
        auVar66 = vunpcklps_avx(auVar67,auVar52);
        auVar54 = vunpckhps_avx(auVar67,auVar52);
        auVar67 = vunpcklps_avx(auVar77,auVar40);
        auVar52 = vunpckhps_avx(auVar77,auVar40);
        aVar15 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar54,auVar52);
        aVar16 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar66,auVar67);
        aVar14 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar66,auVar67);
        pre.ray_space[lVar12].vx.field_0 = aVar16;
        pre.ray_space[lVar12].vy.field_0 = aVar14;
        pre.ray_space[lVar12].vz.field_0 = aVar15;
        uVar28 = uVar28 & uVar28 - 1;
      } while (uVar28 != 0);
      auVar68._8_4_ = 0x7fffffff;
      auVar68._0_8_ = 0x7fffffff7fffffff;
      auVar68._12_4_ = 0x7fffffff;
      auVar78._8_4_ = 0x219392ef;
      auVar78._0_8_ = 0x219392ef219392ef;
      auVar78._12_4_ = 0x219392ef;
      auVar103 = vandps_avx(auVar68,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar103 = vcmpps_avx(auVar103,auVar78,1);
      auVar103 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar78,auVar103
                              );
      auVar87._8_4_ = 0x3f800000;
      auVar87._0_8_ = &DAT_3f8000003f800000;
      auVar87._12_4_ = 0x3f800000;
      auVar40 = vrcpps_avx(auVar103);
      fVar56 = auVar40._0_4_;
      auVar51._0_4_ = auVar103._0_4_ * fVar56;
      fVar59 = auVar40._4_4_;
      auVar51._4_4_ = auVar103._4_4_ * fVar59;
      fVar60 = auVar40._8_4_;
      auVar51._8_4_ = auVar103._8_4_ * fVar60;
      fVar61 = auVar40._12_4_;
      auVar51._12_4_ = auVar103._12_4_ * fVar61;
      auVar103 = vsubps_avx(auVar87,auVar51);
      tray.rdir.field_0._16_4_ = fVar56 + fVar56 * auVar103._0_4_;
      tray.rdir.field_0._20_4_ = fVar59 + fVar59 * auVar103._4_4_;
      tray.rdir.field_0._24_4_ = fVar60 + fVar60 * auVar103._8_4_;
      tray.rdir.field_0._28_4_ = fVar61 + fVar61 * auVar103._12_4_;
      auVar52 = ZEXT816(0) << 0x20;
      auVar103 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar52,5);
      auVar62._8_4_ = 0x20;
      auVar62._0_8_ = 0x2000000020;
      auVar62._12_4_ = 0x20;
      auVar64._8_4_ = 0x30;
      auVar64._0_8_ = 0x3000000030;
      auVar64._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar64,auVar62,auVar103)
      ;
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x20);
      auVar103 = vandps_avx(auVar68,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar103 = vcmpps_avx(auVar103,auVar78,1);
      auVar40 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar78,auVar103)
      ;
      auVar103 = vandps_avx(auVar68,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar103 = vcmpps_avx(auVar103,auVar78,1);
      auVar103 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar78,auVar103
                              );
      auVar54 = vrcpps_avx(auVar40);
      fVar56 = auVar54._0_4_;
      auVar43._0_4_ = auVar40._0_4_ * fVar56;
      fVar59 = auVar54._4_4_;
      auVar43._4_4_ = auVar40._4_4_ * fVar59;
      fVar60 = auVar54._8_4_;
      auVar43._8_4_ = auVar40._8_4_ * fVar60;
      fVar61 = auVar54._12_4_;
      auVar43._12_4_ = auVar40._12_4_ * fVar61;
      auVar40 = vsubps_avx(auVar87,auVar43);
      tray.rdir.field_0._0_4_ = fVar56 + fVar56 * auVar40._0_4_;
      tray.rdir.field_0._4_4_ = fVar59 + fVar59 * auVar40._4_4_;
      tray.rdir.field_0._8_4_ = fVar60 + fVar60 * auVar40._8_4_;
      tray.rdir.field_0._12_4_ = fVar61 + fVar61 * auVar40._12_4_;
      auVar40 = vrcpps_avx(auVar103);
      fVar56 = auVar40._0_4_;
      auVar39._0_4_ = auVar103._0_4_ * fVar56;
      fVar59 = auVar40._4_4_;
      auVar39._4_4_ = auVar103._4_4_ * fVar59;
      fVar60 = auVar40._8_4_;
      auVar39._8_4_ = auVar103._8_4_ * fVar60;
      fVar61 = auVar40._12_4_;
      auVar39._12_4_ = auVar103._12_4_ * fVar61;
      auVar103 = vsubps_avx(auVar87,auVar39);
      tray.rdir.field_0._32_4_ = fVar56 + fVar56 * auVar103._0_4_;
      tray.rdir.field_0._36_4_ = fVar59 + fVar59 * auVar103._4_4_;
      tray.rdir.field_0._40_4_ = fVar60 + fVar60 * auVar103._8_4_;
      tray.rdir.field_0._44_4_ = fVar61 + fVar61 * auVar103._12_4_;
      auVar103 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar52,1);
      auVar48._8_4_ = 0x10;
      auVar48._0_8_ = 0x1000000010;
      auVar48._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar103,auVar48);
      auVar103 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar52,5);
      auVar44._8_4_ = 0x40;
      auVar44._0_8_ = 0x4000000040;
      auVar44._12_4_ = 0x40;
      auVar49._8_4_ = 0x50;
      auVar49._0_8_ = 0x5000000050;
      auVar49._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar49,auVar44,auVar103)
      ;
      auVar103 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar52);
      auVar47 = vmaxps_avx(auVar47,auVar52);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar81 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar103,auVar42);
      auVar40._8_4_ = 0xff800000;
      auVar40._0_8_ = 0xff800000ff800000;
      auVar40._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar40,auVar47,auVar42);
      auVar47 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar42._0_4_ ^ auVar47._0_4_;
      terminated.field_0._4_4_ = auVar42._4_4_ ^ auVar47._4_4_;
      terminated.field_0._8_4_ = auVar42._8_4_ ^ auVar47._8_4_;
      terminated.field_0._12_4_ = auVar42._12_4_ ^ auVar47._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 3;
      }
      else {
        uVar25 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar31 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar31 = &((vfloat<4> *)paVar31)[-1].field_0;
        root.ptr = pNVar33[-1].ptr;
        pNVar33 = pNVar33 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0032bec7:
          iVar27 = 3;
        }
        else {
          aVar88 = *paVar31;
          auVar47 = vcmpps_avx((undefined1  [16])aVar88,(undefined1  [16])tray.tfar.field_0,1);
          uVar26 = vmovmskps_avx(auVar47);
          if (uVar26 == 0) {
            iVar27 = 2;
          }
          else {
            uVar28 = (ulong)(uVar26 & 0xff);
            uVar26 = POPCOUNT(uVar26 & 0xff);
            iVar27 = 0;
            if (uVar26 <= uVar25) {
              do {
                k = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> k & 1) == 0; k = k + 1) {
                  }
                }
                bVar34 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
                if (bVar34) {
                  terminated.field_0.i[k] = -1;
                }
                uVar28 = uVar28 & uVar28 - 1;
              } while (uVar28 != 0);
              auVar47 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar27 = 3;
              auVar104 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              auVar81 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar47[0xf] < '\0') {
                auVar47._8_4_ = 0xff800000;
                auVar47._0_8_ = 0xff800000ff800000;
                auVar47._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar47,
                                   (undefined1  [16])terminated.field_0);
                iVar27 = 2;
              }
            }
            vVar23.field_0 = terminated.field_0;
            if (uVar25 < uVar26) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar47 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                         (undefined1  [16])aVar88,6);
                    if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar47[0xf]) {
                      iVar27 = 2;
                    }
                    else {
                      bVar9 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar11 = This->leafIntersector;
                      local_17b8 = auVar13._0_8_;
                      uStack_17b0 = auVar13._8_8_;
                      valid_o.field_0._0_8_ = local_17b8;
                      valid_o.field_0._8_8_ = uStack_17b0;
                      uVar26 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      if ((uVar26 ^ 0xf) != 0) {
                        uVar28 = (ulong)(byte)(uVar26 ^ 0xf);
                        do {
                          lVar12 = 0;
                          if (uVar28 != 0) {
                            for (; (uVar28 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                            }
                          }
                          cVar24 = (**(code **)((long)pvVar11 + (ulong)bVar9 * 0x40 + 0x18))
                                             (&pre,ray,lVar12,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar24 != '\0') {
                            valid_o.field_0.i[lVar12] = -1;
                          }
                          uVar28 = uVar28 & uVar28 - 1;
                        } while (uVar28 != 0);
                      }
                      auVar20._8_8_ = valid_o.field_0._8_8_;
                      auVar20._0_8_ = valid_o.field_0._0_8_;
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           vorps_avx((undefined1  [16])vVar23.field_0,auVar20);
                      auVar47 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                      if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar47[0xf]) {
                        iVar27 = 3;
                      }
                      else {
                        auVar46._8_4_ = 0xff800000;
                        auVar46._0_8_ = 0xff800000ff800000;
                        auVar46._12_4_ = 0xff800000;
                        tray.tfar.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar46,
                                           (undefined1  [16])terminated.field_0);
                        iVar27 = 0;
                      }
                    }
                    auVar104 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    auVar81 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    break;
                  }
                  goto LAB_0032bec7;
                }
                uVar30 = root.ptr & 0xfffffffffffffff0;
                auVar91 = ZEXT1664(auVar81._0_16_);
                uVar28 = 0;
                uVar32 = 8;
                do {
                  uVar10 = *(ulong *)(uVar30 + uVar28 * 8);
                  if (uVar10 != 8) {
                    if ((root.ptr & 7) == 0) {
                      uVar29 = *(undefined4 *)(root.ptr + 0x20 + uVar28 * 4);
                      auVar35._4_4_ = uVar29;
                      auVar35._0_4_ = uVar29;
                      auVar35._8_4_ = uVar29;
                      auVar35._12_4_ = uVar29;
                      auVar21._4_4_ = tray.org.field_0._4_4_;
                      auVar21._0_4_ = tray.org.field_0._0_4_;
                      auVar21._8_4_ = tray.org.field_0._8_4_;
                      auVar21._12_4_ = tray.org.field_0._12_4_;
                      auVar22._8_8_ = tray.org.field_0._24_8_;
                      auVar22._0_8_ = tray.org.field_0._16_8_;
                      auVar47 = vsubps_avx(auVar35,auVar21);
                      auVar45._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar47._0_4_;
                      auVar45._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar47._4_4_;
                      auVar45._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar47._8_4_;
                      auVar45._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar47._12_4_;
                      uVar29 = *(undefined4 *)(root.ptr + 0x40 + uVar28 * 4);
                      auVar36._4_4_ = uVar29;
                      auVar36._0_4_ = uVar29;
                      auVar36._8_4_ = uVar29;
                      auVar36._12_4_ = uVar29;
                      auVar47 = vsubps_avx(auVar36,auVar22);
                      auVar41._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar47._0_4_;
                      auVar41._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar47._4_4_;
                      auVar41._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar47._8_4_;
                      auVar41._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar47._12_4_;
                      uVar29 = *(undefined4 *)(root.ptr + 0x60 + uVar28 * 4);
                      auVar37._4_4_ = uVar29;
                      auVar37._0_4_ = uVar29;
                      auVar37._8_4_ = uVar29;
                      auVar37._12_4_ = uVar29;
                      auVar47 = vsubps_avx(auVar37,(undefined1  [16])
                                                   tray.org.field_0.field_0.z.field_0);
                      auVar38._0_4_ = tray.rdir.field_0._32_4_ * auVar47._0_4_;
                      auVar38._4_4_ = tray.rdir.field_0._36_4_ * auVar47._4_4_;
                      auVar38._8_4_ = tray.rdir.field_0._40_4_ * auVar47._8_4_;
                      auVar38._12_4_ = tray.rdir.field_0._44_4_ * auVar47._12_4_;
                      uVar29 = *(undefined4 *)(root.ptr + 0x30 + uVar28 * 4);
                      auVar69._4_4_ = uVar29;
                      auVar69._0_4_ = uVar29;
                      auVar69._8_4_ = uVar29;
                      auVar69._12_4_ = uVar29;
                      auVar47 = vsubps_avx(auVar69,auVar21);
                      auVar50._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar47._0_4_;
                      auVar50._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar47._4_4_;
                      auVar50._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar47._8_4_;
                      auVar50._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar47._12_4_;
                      uVar29 = *(undefined4 *)(root.ptr + 0x50 + uVar28 * 4);
                      auVar57._4_4_ = uVar29;
                      auVar57._0_4_ = uVar29;
                      auVar57._8_4_ = uVar29;
                      auVar57._12_4_ = uVar29;
                      auVar47 = vsubps_avx(auVar57,auVar22);
                      auVar53._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar47._0_4_;
                      auVar53._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar47._4_4_;
                      auVar53._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar47._8_4_;
                      auVar53._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar47._12_4_;
                      uVar29 = *(undefined4 *)(root.ptr + 0x70 + uVar28 * 4);
                      auVar58._4_4_ = uVar29;
                      auVar58._0_4_ = uVar29;
                      auVar58._8_4_ = uVar29;
                      auVar58._12_4_ = uVar29;
                      auVar47 = vsubps_avx(auVar58,(undefined1  [16])
                                                   tray.org.field_0.field_0.z.field_0);
                      auVar55._0_4_ = tray.rdir.field_0._32_4_ * auVar47._0_4_;
                      auVar55._4_4_ = tray.rdir.field_0._36_4_ * auVar47._4_4_;
                      auVar55._8_4_ = tray.rdir.field_0._40_4_ * auVar47._8_4_;
                      auVar55._12_4_ = tray.rdir.field_0._44_4_ * auVar47._12_4_;
                    }
                    else {
                      fVar56 = *(float *)(uVar30 + 0x20 + uVar28 * 4);
                      fVar59 = *(float *)(uVar30 + 0x30 + uVar28 * 4);
                      fVar60 = *(float *)(uVar30 + 0x40 + uVar28 * 4);
                      fVar61 = *(float *)(uVar30 + 0x50 + uVar28 * 4);
                      fVar1 = *(float *)(uVar30 + 0x60 + uVar28 * 4);
                      fVar2 = *(float *)(uVar30 + 0x70 + uVar28 * 4);
                      fVar3 = *(float *)(uVar30 + 0x80 + uVar28 * 4);
                      fVar4 = *(float *)(uVar30 + 0x90 + uVar28 * 4);
                      fVar5 = *(float *)(uVar30 + 0xa0 + uVar28 * 4);
                      auVar79._0_4_ =
                           (float)tray.dir.field_0._0_4_ * fVar56 +
                           (float)tray.dir.field_0._16_4_ * fVar61 +
                           fVar3 * (float)tray.dir.field_0._32_4_;
                      auVar79._4_4_ =
                           (float)tray.dir.field_0._4_4_ * fVar56 +
                           (float)tray.dir.field_0._20_4_ * fVar61 +
                           fVar3 * (float)tray.dir.field_0._36_4_;
                      auVar79._8_4_ =
                           (float)tray.dir.field_0._8_4_ * fVar56 +
                           (float)tray.dir.field_0._24_4_ * fVar61 +
                           fVar3 * (float)tray.dir.field_0._40_4_;
                      auVar79._12_4_ =
                           (float)tray.dir.field_0._12_4_ * fVar56 +
                           (float)tray.dir.field_0._28_4_ * fVar61 +
                           fVar3 * (float)tray.dir.field_0._44_4_;
                      auVar89._0_4_ =
                           (float)tray.dir.field_0._0_4_ * fVar59 +
                           (float)tray.dir.field_0._16_4_ * fVar1 +
                           (float)tray.dir.field_0._32_4_ * fVar4;
                      auVar89._4_4_ =
                           (float)tray.dir.field_0._4_4_ * fVar59 +
                           (float)tray.dir.field_0._20_4_ * fVar1 +
                           (float)tray.dir.field_0._36_4_ * fVar4;
                      auVar89._8_4_ =
                           (float)tray.dir.field_0._8_4_ * fVar59 +
                           (float)tray.dir.field_0._24_4_ * fVar1 +
                           (float)tray.dir.field_0._40_4_ * fVar4;
                      auVar89._12_4_ =
                           (float)tray.dir.field_0._12_4_ * fVar59 +
                           (float)tray.dir.field_0._28_4_ * fVar1 +
                           (float)tray.dir.field_0._44_4_ * fVar4;
                      auVar70._0_4_ =
                           (float)tray.dir.field_0._0_4_ * fVar60 +
                           (float)tray.dir.field_0._16_4_ * fVar2 +
                           (float)tray.dir.field_0._32_4_ * fVar5;
                      auVar70._4_4_ =
                           (float)tray.dir.field_0._4_4_ * fVar60 +
                           (float)tray.dir.field_0._20_4_ * fVar2 +
                           (float)tray.dir.field_0._36_4_ * fVar5;
                      auVar70._8_4_ =
                           (float)tray.dir.field_0._8_4_ * fVar60 +
                           (float)tray.dir.field_0._24_4_ * fVar2 +
                           (float)tray.dir.field_0._40_4_ * fVar5;
                      auVar70._12_4_ =
                           (float)tray.dir.field_0._12_4_ * fVar60 +
                           (float)tray.dir.field_0._28_4_ * fVar2 +
                           (float)tray.dir.field_0._44_4_ * fVar5;
                      auVar100._8_4_ = 0x7fffffff;
                      auVar100._0_8_ = 0x7fffffff7fffffff;
                      auVar100._12_4_ = 0x7fffffff;
                      auVar47 = vandps_avx(auVar79,auVar100);
                      auVar101._8_4_ = 0x219392ef;
                      auVar101._0_8_ = 0x219392ef219392ef;
                      auVar101._12_4_ = 0x219392ef;
                      auVar47 = vcmpps_avx(auVar47,auVar101,1);
                      auVar103 = vblendvps_avx(auVar79,auVar101,auVar47);
                      auVar47 = vandps_avx(auVar89,auVar100);
                      auVar47 = vcmpps_avx(auVar47,auVar101,1);
                      auVar40 = vblendvps_avx(auVar89,auVar101,auVar47);
                      auVar47 = vandps_avx(auVar70,auVar100);
                      auVar47 = vcmpps_avx(auVar47,auVar101,1);
                      auVar47 = vblendvps_avx(auVar70,auVar101,auVar47);
                      fVar6 = *(float *)(uVar30 + 0xb0 + uVar28 * 4);
                      auVar54 = vrcpps_avx(auVar103);
                      fVar65 = auVar54._0_4_;
                      auVar80._0_4_ = fVar65 * auVar103._0_4_;
                      fVar71 = auVar54._4_4_;
                      auVar80._4_4_ = fVar71 * auVar103._4_4_;
                      fVar72 = auVar54._8_4_;
                      auVar80._8_4_ = fVar72 * auVar103._8_4_;
                      fVar73 = auVar54._12_4_;
                      auVar80._12_4_ = fVar73 * auVar103._12_4_;
                      auVar102._8_4_ = 0x3f800000;
                      auVar102._0_8_ = &DAT_3f8000003f800000;
                      auVar102._12_4_ = 0x3f800000;
                      auVar103 = vsubps_avx(auVar102,auVar80);
                      fVar65 = fVar65 + fVar65 * auVar103._0_4_;
                      fVar71 = fVar71 + fVar71 * auVar103._4_4_;
                      fVar72 = fVar72 + fVar72 * auVar103._8_4_;
                      fVar73 = fVar73 + fVar73 * auVar103._12_4_;
                      auVar103 = vrcpps_avx(auVar40);
                      fVar74 = auVar103._0_4_;
                      auVar90._0_4_ = fVar74 * auVar40._0_4_;
                      fVar82 = auVar103._4_4_;
                      auVar90._4_4_ = fVar82 * auVar40._4_4_;
                      fVar83 = auVar103._8_4_;
                      auVar90._8_4_ = fVar83 * auVar40._8_4_;
                      fVar84 = auVar103._12_4_;
                      auVar90._12_4_ = fVar84 * auVar40._12_4_;
                      auVar103 = vsubps_avx(auVar102,auVar90);
                      fVar74 = fVar74 + fVar74 * auVar103._0_4_;
                      fVar82 = fVar82 + fVar82 * auVar103._4_4_;
                      fVar83 = fVar83 + fVar83 * auVar103._8_4_;
                      fVar84 = fVar84 + fVar84 * auVar103._12_4_;
                      auVar103 = vrcpps_avx(auVar47);
                      fVar85 = auVar103._0_4_;
                      auVar96._0_4_ = fVar85 * auVar47._0_4_;
                      fVar92 = auVar103._4_4_;
                      auVar96._4_4_ = fVar92 * auVar47._4_4_;
                      fVar93 = auVar103._8_4_;
                      auVar96._8_4_ = fVar93 * auVar47._8_4_;
                      fVar94 = auVar103._12_4_;
                      auVar96._12_4_ = fVar94 * auVar47._12_4_;
                      auVar47 = vsubps_avx(auVar102,auVar96);
                      fVar85 = fVar85 + fVar85 * auVar47._0_4_;
                      fVar92 = fVar92 + fVar92 * auVar47._4_4_;
                      fVar93 = fVar93 + fVar93 * auVar47._8_4_;
                      fVar94 = fVar94 + fVar94 * auVar47._12_4_;
                      fVar7 = *(float *)(uVar30 + 0xc0 + uVar28 * 4);
                      fVar8 = *(float *)(uVar30 + 0xd0 + uVar28 * 4);
                      fVar95 = (float)tray.org.field_0._16_8_;
                      fVar97 = (float)((ulong)tray.org.field_0._16_8_ >> 0x20);
                      fVar98 = (float)tray.org.field_0._24_8_;
                      fVar99 = (float)((ulong)tray.org.field_0._24_8_ >> 0x20);
                      uVar26 = auVar104._0_4_;
                      uVar17 = auVar104._4_4_;
                      uVar18 = auVar104._8_4_;
                      uVar19 = auVar104._12_4_;
                      auVar45._0_4_ =
                           (fVar56 * (float)tray.org.field_0._0_4_ +
                           fVar6 + fVar3 * (float)tray.org.field_0._32_4_ + fVar95 * fVar61) *
                           (float)((uint)fVar65 ^ uVar26);
                      auVar45._4_4_ =
                           (fVar56 * (float)tray.org.field_0._4_4_ +
                           fVar6 + fVar3 * (float)tray.org.field_0._36_4_ + fVar97 * fVar61) *
                           (float)((uint)fVar71 ^ uVar17);
                      auVar45._8_4_ =
                           (fVar56 * (float)tray.org.field_0._8_4_ +
                           fVar6 + fVar3 * (float)tray.org.field_0._40_4_ + fVar98 * fVar61) *
                           (float)((uint)fVar72 ^ uVar18);
                      auVar45._12_4_ =
                           (fVar56 * (float)tray.org.field_0._12_4_ +
                           fVar6 + fVar3 * (float)tray.org.field_0._44_4_ + fVar99 * fVar61) *
                           (float)((uint)fVar73 ^ uVar19);
                      auVar41._0_4_ =
                           (fVar59 * (float)tray.org.field_0._0_4_ +
                           fVar95 * fVar1 + fVar7 + (float)tray.org.field_0._32_4_ * fVar4) *
                           (float)((uint)fVar74 ^ uVar26);
                      auVar41._4_4_ =
                           (fVar59 * (float)tray.org.field_0._4_4_ +
                           fVar97 * fVar1 + fVar7 + (float)tray.org.field_0._36_4_ * fVar4) *
                           (float)((uint)fVar82 ^ uVar17);
                      auVar41._8_4_ =
                           (fVar59 * (float)tray.org.field_0._8_4_ +
                           fVar98 * fVar1 + fVar7 + (float)tray.org.field_0._40_4_ * fVar4) *
                           (float)((uint)fVar83 ^ uVar18);
                      auVar41._12_4_ =
                           (fVar59 * (float)tray.org.field_0._12_4_ +
                           fVar99 * fVar1 + fVar7 + (float)tray.org.field_0._44_4_ * fVar4) *
                           (float)((uint)fVar84 ^ uVar19);
                      auVar38._0_4_ =
                           (fVar60 * (float)tray.org.field_0._0_4_ +
                           fVar95 * fVar2 + fVar8 + (float)tray.org.field_0._32_4_ * fVar5) *
                           (float)((uint)fVar85 ^ uVar26);
                      auVar38._4_4_ =
                           (fVar60 * (float)tray.org.field_0._4_4_ +
                           fVar97 * fVar2 + fVar8 + (float)tray.org.field_0._36_4_ * fVar5) *
                           (float)((uint)fVar92 ^ uVar17);
                      auVar38._8_4_ =
                           (fVar60 * (float)tray.org.field_0._8_4_ +
                           fVar98 * fVar2 + fVar8 + (float)tray.org.field_0._40_4_ * fVar5) *
                           (float)((uint)fVar93 ^ uVar18);
                      auVar38._12_4_ =
                           (fVar60 * (float)tray.org.field_0._12_4_ +
                           fVar99 * fVar2 + fVar8 + (float)tray.org.field_0._44_4_ * fVar5) *
                           (float)((uint)fVar94 ^ uVar19);
                      auVar50._0_4_ = fVar65 + auVar45._0_4_;
                      auVar50._4_4_ = fVar71 + auVar45._4_4_;
                      auVar50._8_4_ = fVar72 + auVar45._8_4_;
                      auVar50._12_4_ = fVar73 + auVar45._12_4_;
                      auVar53._0_4_ = fVar74 + auVar41._0_4_;
                      auVar53._4_4_ = fVar82 + auVar41._4_4_;
                      auVar53._8_4_ = fVar83 + auVar41._8_4_;
                      auVar53._12_4_ = fVar84 + auVar41._12_4_;
                      auVar81 = ZEXT1664(CONCAT412(0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar55._0_4_ = fVar85 + auVar38._0_4_;
                      auVar55._4_4_ = fVar92 + auVar38._4_4_;
                      auVar55._8_4_ = fVar93 + auVar38._8_4_;
                      auVar55._12_4_ = fVar94 + auVar38._12_4_;
                      auVar91 = ZEXT1664(auVar91._0_16_);
                    }
                    auVar47 = vpminsd_avx(auVar45,auVar50);
                    auVar103 = vpminsd_avx(auVar41,auVar53);
                    auVar47 = vpmaxsd_avx(auVar47,auVar103);
                    auVar103 = vpminsd_avx(auVar38,auVar55);
                    auVar103 = vpmaxsd_avx(auVar47,auVar103);
                    auVar47 = vpmaxsd_avx(auVar45,auVar50);
                    auVar40 = vpmaxsd_avx(auVar41,auVar53);
                    auVar40 = vpminsd_avx(auVar47,auVar40);
                    auVar47 = vpmaxsd_avx(auVar38,auVar55);
                    auVar40 = vpminsd_avx(auVar40,auVar47);
                    auVar47 = vpmaxsd_avx(auVar103,(undefined1  [16])tray.tnear.field_0);
                    auVar40 = vpminsd_avx(auVar40,(undefined1  [16])tray.tfar.field_0);
                    auVar47 = vcmpps_avx(auVar47,auVar40,2);
                    if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar47[0xf] < '\0') {
                      auVar47 = vblendvps_avx(auVar81._0_16_,auVar103,auVar47);
                      if (uVar32 != 8) {
                        pNVar33->ptr = uVar32;
                        pNVar33 = pNVar33 + 1;
                        *paVar31 = auVar91._0_16_;
                        paVar31 = paVar31 + 1;
                      }
                      auVar91 = ZEXT1664(auVar47);
                      uVar32 = uVar10;
                    }
                  }
                  aVar88 = auVar91._0_16_;
                } while ((uVar10 != 8) && (bVar34 = uVar28 < 3, uVar28 = uVar28 + 1, bVar34));
                iVar27 = 0;
                if (uVar32 == 8) {
LAB_0032bd9a:
                  bVar34 = false;
                  iVar27 = 4;
                }
                else {
                  auVar47 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar88,
                                       6);
                  uVar29 = vmovmskps_avx(auVar47);
                  bVar34 = true;
                  if ((uint)POPCOUNT(uVar29) <= uVar25) {
                    pNVar33->ptr = uVar32;
                    pNVar33 = pNVar33 + 1;
                    *paVar31 = aVar88;
                    paVar31 = paVar31 + 1;
                    goto LAB_0032bd9a;
                  }
                }
                root.ptr = uVar32;
              } while (bVar34);
            }
          }
        }
      } while (iVar27 != 3);
      auVar13 = vandps_avx(auVar42,(undefined1  [16])terminated.field_0);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      auVar13 = vmaskmovps_avx(auVar13,auVar42);
      *(undefined1 (*) [16])(ray + 0x80) = auVar13;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }